

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void opj_mqc_init_enc(opj_mqc_t *mqc,OPJ_BYTE *bp)

{
  OPJ_BYTE *bp_local;
  opj_mqc_t *mqc_local;
  
  mqc->curctx = mqc->ctxs;
  mqc->a = 0x8000;
  mqc->c = 0;
  mqc->bp = bp + -1;
  mqc->ct = 0xc;
  if (*mqc->bp != 0xff) {
    mqc->start = bp;
    mqc->end_of_byte_stream_counter = 0;
    return;
  }
  __assert_fail("*(mqc->bp) != 0xff",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/mqc.c"
                ,0xcd,"void opj_mqc_init_enc(opj_mqc_t *, OPJ_BYTE *)");
}

Assistant:

void opj_mqc_init_enc(opj_mqc_t *mqc, OPJ_BYTE *bp)
{
    /* To avoid the curctx pointer to be dangling, but not strictly */
    /* required as the current context is always set before encoding */
    opj_mqc_setcurctx(mqc, 0);

    /* As specified in Figure C.10 - Initialization of the encoder */
    /* (C.2.8 Initialization of the encoder (INITENC)) */
    mqc->a = 0x8000;
    mqc->c = 0;
    /* Yes, we point before the start of the buffer, but this is safe */
    /* given opj_tcd_code_block_enc_allocate_data() */
    mqc->bp = bp - 1;
    mqc->ct = 12;
    /* At this point we should test *(mqc->bp) against 0xFF, but this is not */
    /* necessary, as this is only used at the beginning of the code block */
    /* and our initial fake byte is set at 0 */
    assert(*(mqc->bp) != 0xff);

    mqc->start = bp;
    mqc->end_of_byte_stream_counter = 0;
}